

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall Parser::dcl(Parser *this)

{
  bool bVar1;
  FunctionNode *local_20;
  FunctionNode *f;
  Parser *this_local;
  
  f = (FunctionNode *)this;
  bVar1 = is_builtin_type(this);
  if ((bVar1) && (local_20 = function_definition(this), local_20 != (FunctionNode *)0x0)) {
    std::vector<FunctionNode_*,_std::allocator<FunctionNode_*>_>::push_back
              (&(this->data).functions,&local_20);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::dcl()
{
  if (is_builtin_type()) {
    FunctionNode* f = function_definition();
    if (f) {
      data.functions.push_back(f);
      return true;
    }
  }

  return false;
}